

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionResponse>::
DeserializeUniValue(JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionResponse> *this,
                   UniValue *value)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  undefined4 extraout_var_00;
  pointer ppVar4;
  CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse> *table_info_1;
  _Self local_f8;
  iterator iter_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *child;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  json_map;
  JsonTableMap<cfd::js::api::json::ElementsDecodeRawTransactionResponse> mapper;
  CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse> *table_info;
  _Self local_60;
  iterator iter;
  undefined1 local_48 [8];
  JsonTableMap<cfd::js::api::json::ElementsDecodeRawTransactionResponse> mapper_1;
  UniValue *value_local;
  JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionResponse> *this_local;
  
  mapper_1._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)value;
  bVar1 = UniValue::isArray(value);
  if (bVar1) {
    iVar2 = (*this->_vptr_JsonClassBase[9])();
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
           *)local_48,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
           *)CONCAT44(extraout_var,iVar2));
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                    *)local_48);
    if (sVar3 == 1) {
      (*this->_vptr_JsonClassBase[4])();
      local_60._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                    *)local_48);
      table_info = (CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse> *
                   )std::
                    end<std::map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>>>>>
                              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                                *)local_48);
      bVar1 = std::operator!=(&local_60,(_Self *)&table_info);
      if (bVar1) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>
                 ::operator->(&local_60);
        std::
        function<void_(cfd::js::api::json::ElementsDecodeRawTransactionResponse_&,_const_UniValue_&)>
        ::operator()(&(ppVar4->second).set_function,(ElementsDecodeRawTransactionResponse *)this,
                     (UniValue *)mapper_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      (*this->_vptr_JsonClassBase[5])();
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
            *)local_48);
  }
  else {
    bVar1 = UniValue::isObject((UniValue *)mapper_1._M_t._M_impl.super__Rb_tree_header._M_node_count
                              );
    if (bVar1) {
      (*this->_vptr_JsonClassBase[4])();
      iVar2 = (*this->_vptr_JsonClassBase[9])();
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
             *)&json_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
             *)CONCAT44(extraout_var_00,iVar2));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&__range3);
      UniValue::getObjMap((map *)mapper_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                        *)&__range3);
      child = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                        *)&__range3);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&child), bVar1) {
        iter_1._M_node =
             (_Base_ptr)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
             ::operator*(&__end3);
        local_f8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                     *)&json_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    (key_type *)iter_1._M_node);
        table_info_1 = (CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>
                        *)std::
                          end<std::map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>>>>>
                                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                                      *)&json_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar1 = std::operator!=(&local_f8,(_Self *)&table_info_1);
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>
                   ::operator->(&local_f8);
          std::
          function<void_(cfd::js::api::json::ElementsDecodeRawTransactionResponse_&,_const_UniValue_&)>
          ::operator()(&(ppVar4->second).set_function,(ElementsDecodeRawTransactionResponse *)this,
                       (UniValue *)(iter_1._M_node + 1));
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
        ::operator++(&__end3);
      }
      (*this->_vptr_JsonClassBase[5])();
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              *)&__range3);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
              *)&json_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  return;
}

Assistant:

virtual void DeserializeUniValue(const UniValue& value) {
    if (value.isArray()) {
      // If root is one list, take over to child class
      JsonTableMap<TYPE> mapper = GetJsonMapper();
      if (mapper.size() == 1) {
        PreDeserialize();
        auto iter = mapper.begin();
        if (iter != end(mapper)) {
          CLASS_FUNCTION_TABLE<TYPE>* table_info = &iter->second;
          table_info->set_function(*(reinterpret_cast<TYPE*>(this)), value);
        }
        PostDeserialize();
      }
      return;
    } else if (!value.isObject()) {
      return;
    }
    PreDeserialize();
    JsonTableMap<TYPE> mapper = GetJsonMapper();
    std::map<std::string, UniValue> json_map;
    value.getObjMap(json_map);
    for (const auto& child : json_map) {
      auto iter = mapper.find(child.first);
      if (iter != end(mapper)) {
        CLASS_FUNCTION_TABLE<TYPE>* table_info = &iter->second;
        table_info->set_function(
            *(reinterpret_cast<TYPE*>(this)), child.second);
      }
    }
    PostDeserialize();
  }